

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheVk::Resource::Resource
          (Resource *this,DescriptorType _Type,bool _HasImmutableSampler)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  bool _HasImmutableSampler_local;
  DescriptorType _Type_local;
  Resource *this_local;
  
  this->Type = _Type;
  this->HasImmutableSampler = _HasImmutableSampler;
  this->BufferDynamicOffset = 0;
  msg.field_2._M_local_buf[0xe] = _HasImmutableSampler;
  msg.field_2._M_local_buf[0xf] = _Type;
  RefCntAutoPtr<Diligent::IDeviceObject>::RefCntAutoPtr(&this->pObject);
  this->BufferBaseOffset = 0;
  this->BufferRangeSize = 0;
  if (((this->Type != CombinedImageSampler) && (this->Type != Sampler)) &&
     ((this->HasImmutableSampler & 1U) != 0)) {
    FormatString<char[89]>
              ((string *)local_38,
               (char (*) [89])
               "Immutable sampler can only be assigned to a combined image sampler or a separate sampler"
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Resource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0x68);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

explicit Resource(DescriptorType _Type, bool _HasImmutableSampler) noexcept :
            Type{_Type},
            HasImmutableSampler{_HasImmutableSampler}
        {
            VERIFY(Type == DescriptorType::CombinedImageSampler || Type == DescriptorType::Sampler || !HasImmutableSampler,
                   "Immutable sampler can only be assigned to a combined image sampler or a separate sampler");
        }